

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::remap_pixel_local_storage
          (CompilerGLSL *this,
          vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *inputs,
          vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *outputs)

{
  pointer pPVar1;
  pointer pPVar2;
  
  pPVar1 = (this->pls_inputs).
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl
           .super__Vector_impl_data._M_start;
  pPVar2 = (inputs->
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  (this->pls_inputs).
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (inputs->super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->pls_inputs).
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar2;
  (this->pls_inputs).
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (inputs->super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (inputs->super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (inputs->super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (inputs->super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pPVar1 != (pointer)0x0) {
    operator_delete(pPVar1);
  }
  pPVar1 = (this->pls_outputs).
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl
           .super__Vector_impl_data._M_start;
  pPVar2 = (outputs->
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  (this->pls_outputs).
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
  super__Vector_impl_data._M_start =
       (outputs->super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->pls_outputs).
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar2;
  (this->pls_outputs).
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (outputs->super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (outputs->super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (outputs->super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (outputs->super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pPVar1 != (pointer)0x0) {
    operator_delete(pPVar1);
  }
  remap_pls_variables(this);
  return;
}

Assistant:

void remap_pixel_local_storage(std::vector<PlsRemap> inputs, std::vector<PlsRemap> outputs)
	{
		pls_inputs = std::move(inputs);
		pls_outputs = std::move(outputs);
		remap_pls_variables();
	}